

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.h
# Opt level: O2

char * Person::AccessLevel(int level)

{
  if (level - 1U < 4) {
    return &DAT_001052d0 + *(int *)(&DAT_001052d0 + (ulong)(level - 1U) * 4);
  }
  return "non-level";
}

Assistant:

static char* AccessLevel(int level){
        if(level == 1){
            return (char*)("Gray");
        }else if(level == 2){
            return (char*)("Green");
        }else if(level == 3){
            return (char*)("Yellow");
        }else if(level == 4){
            return (char*)("Red");
        }
        return (char*)"non-level";
    }